

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_write.c
# Opt level: O1

char * str_replace(char **s,size_t pos,size_t len,char *replacement)

{
  size_t sVar1;
  size_t __n;
  char *pcVar2;
  ulong uVar3;
  
  if (s == (char **)0x0) {
    return (char *)0x0;
  }
  pcVar2 = *s;
  if (pcVar2 == (char *)0x0) {
LAB_0010275f:
    pcVar2 = (char *)0x0;
  }
  else {
    sVar1 = strlen(pcVar2);
    __n = strlen(replacement);
    if (sVar1 < pos) {
      pos = sVar1;
    }
    uVar3 = sVar1 - pos;
    if (pos + len <= sVar1) {
      uVar3 = len;
    }
    if (uVar3 < __n) {
      pcVar2 = (char *)realloc(pcVar2,((sVar1 + __n) - uVar3) + 1);
      *s = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_0010275f;
    }
    memmove(*s + __n + pos,*s + uVar3 + pos,(sVar1 - (uVar3 + pos)) + 1);
    memcpy(*s + pos,replacement,__n);
    pcVar2 = *s;
  }
  return pcVar2;
}

Assistant:

char* str_replace (char** s, size_t pos, size_t len, char* replacement)
{
  if (!s || !*s)
    return NULL;
  size_t totallen = strlen(*s);
  size_t replacementlen = strlen(replacement);
  if (pos > totallen)
    pos = totallen;
  if (pos + len > totallen)
    len = totallen - pos;
  if (replacementlen > len) {
    if ((*s = (char*)realloc(*s, totallen - len + replacementlen + 1)) == NULL) {
      //memory allocation error
      return NULL;
    }
  }
  memmove(*s + pos + replacementlen, *s + pos + len, totallen - pos - len + 1);
  memcpy(*s + pos, replacement, replacementlen);
  return *s;
}